

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O1

vector<char,_std::allocator<char>_> *
readFile(vector<char,_std::allocator<char>_> *__return_storage_ptr__,string *filename)

{
  char cVar1;
  size_type __n;
  runtime_error *this;
  ifstream file;
  allocator_type local_219;
  char local_218 [520];
  
  std::ifstream::ifstream(local_218,(string *)filename,_S_bin|_S_ate);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    __n = std::istream::tellg();
    std::vector<char,_std::allocator<char>_>::vector(__return_storage_ptr__,__n,&local_219);
    std::istream::seekg(local_218,0,0);
    std::istream::read(local_218,
                       (long)(__return_storage_ptr__->
                             super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                             super__Vector_impl_data._M_start);
    std::ifstream::close();
    std::ifstream::~ifstream(local_218);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"failed to open file!");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<char> readFile(const std::string& filename) {
    std::ifstream file(filename, std::ios::ate | std::ios::binary);

    if (!file.is_open()) {
        throw std::runtime_error("failed to open file!");
    }

    size_t file_size = (size_t)file.tellg();
    std::vector<char> buffer(file_size);

    file.seekg(0);
    file.read(buffer.data(), static_cast<std::streamsize>(file_size));
    file.close();

    return buffer;
}